

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::XercesStep> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  BaseRefVectorOf<xercesc_4_0::XercesStep> *pBVar2;
  XSerializeEngine *manager_00;
  XercesStep *pXVar3;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  ulong uVar4;
  XMLSize_t XVar5;
  XMLSize_t vectorLength;
  XMLSize_t local_38;
  
  manager_00 = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    if (*objToLoad == (RefVectorOf<xercesc_4_0::XercesStep> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      pBVar2 = (BaseRefVectorOf<xercesc_4_0::XercesStep> *)XMemory::operator_new(0x30,manager);
      manager_00 = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      XVar5 = 0x10;
      if (-1 < initSize) {
        XVar5 = (XMLSize_t)(uint)initSize;
      }
      BaseRefVectorOf<xercesc_4_0::XercesStep>::BaseRefVectorOf
                (pBVar2,XVar5,toAdopt,(MemoryManager *)manager_00);
      pBVar2->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00416710;
      *objToLoad = (RefVectorOf<xercesc_4_0::XercesStep> *)pBVar2;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_38 = 0;
    XSerializeEngine::readSize(serEng,&local_38);
    if (local_38 != 0) {
      uVar4 = 0;
      __buf = extraout_RDX;
      do {
        pXVar3 = (XercesStep *)XSerializeEngine::read(serEng,0x446a18,__buf,(size_t)manager_00);
        pBVar2 = &(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>;
        BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(pBVar2,1);
        XVar5 = pBVar2->fCurCount;
        manager_00 = (XSerializeEngine *)pBVar2->fElemList;
        *(XercesStep **)((long)&manager_00->fStoreLoad + XVar5 * 8) = pXVar3;
        pBVar2->fCurCount = XVar5 + 1;
        uVar4 = uVar4 + 1;
        __buf = extraout_RDX_00;
      } while (uVar4 < local_38);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<XercesStep>** objToLoad
                                   , int                       initSize
                                   , bool                      toAdopt
                                   , XSerializeEngine&         serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<XercesStep>(
                                                     initSize
                                                   , toAdopt
                                                   , serEng.getMemoryManager()
                                                    );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            XercesStep*  data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }

}